

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_trace.cpp
# Opt level: O0

bool __thiscall FTraceInfo::TraceTraverse(FTraceInfo *this,int ptflags)

{
  double *pdVar1;
  ETraceResult EVar2;
  AActor *pAVar3;
  sector_t *psVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  intercept_t *in_00;
  xfloor *this_00;
  F3DFloor **ppFVar9;
  secplane_t *psVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  TVector3<double> local_2a8;
  TVector3<double> local_290;
  undefined1 local_278 [8];
  FTraceResults hsecResult;
  FTraceResults *res;
  TVector2<double> local_190;
  int local_180;
  int local_17c;
  TVector3<double> local_178;
  TFlags<ActorFlag,_unsigned_int> local_160;
  TFlags<ActorFlag,_unsigned_int> local_15c;
  TVector3<double> local_158;
  FLinePortal *local_140;
  FLinePortal *port;
  TVector2<double> local_128;
  sector_t *local_118;
  sector_t *entersector;
  double local_100;
  double portz_1;
  double portz;
  undefined1 local_d8 [8];
  DVector3 hit;
  double dist;
  TVector2<double> local_a8;
  F3DFloor *local_98;
  F3DFloor *rover;
  iterator __end3;
  iterator __begin3;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range3;
  int local_64;
  int lastsplashsector;
  intercept_t *in;
  FPathTraverse it;
  int ptflags_local;
  FTraceInfo *this_local;
  
  it._60_4_ = ptflags;
  Setup3DFloors(this);
  FPathTraverse::FPathTraverse
            ((FPathTraverse *)&in,(this->Start).X,(this->Start).Y,(this->Vec).X * this->MaxDist,
             (this->Vec).Y * this->MaxDist,it._60_4_ | 8,this->startfrac);
  local_64 = -1;
LAB_006db021:
  do {
    in_00 = FPathTraverse::Next((FPathTraverse *)&in);
    if (in_00 == (intercept_t *)0x0) goto LAB_006db88a;
    if ((this->Results->Crossed3DWater == (F3DFloor *)0x0) &&
       (local_64 != this->CurSector->sectornum)) {
      this_00 = &this->CurSector->e->XFloor;
      __end3 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
      rover = (F3DFloor *)
              TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
      while (bVar5 = TIterator<F3DFloor_*>::operator!=(&__end3,(TIterator<F3DFloor_*> *)&rover),
            bVar5) {
        ppFVar9 = TIterator<F3DFloor_*>::operator*(&__end3);
        local_98 = *ppFVar9;
        if ((((local_98->flags & 1) != 0) && ((local_98->flags & 0x10) != 0)) &&
           (bVar5 = Check3DFloorPlane(this,local_98,false), bVar5)) {
          psVar10 = (local_98->top).plane;
          TVector2<double>::TVector2(&local_a8,&this->Results->HitPos);
          dVar13 = secplane_t::ZatPoint(psVar10,&local_a8);
          psVar4 = this->CurSector;
          TVector2<double>::TVector2((TVector2<double> *)&dist,&this->Results->HitPos);
          dVar11 = secplane_t::ZatPoint(&psVar4->floorplane,(DVector2 *)&dist);
          if (dVar11 < dVar13) {
            this->Results->Crossed3DWater = local_98;
            TVector3<double>::operator=(&this->Results->Crossed3DWaterPos,&this->Results->HitPos);
            this->Results->Distance = 0.0;
          }
        }
        TIterator<F3DFloor_*>::operator++(&__end3);
      }
      local_64 = this->CurSector->sectornum;
    }
    hit.Z = this->MaxDist * in_00->frac;
    ::operator*((TVector3<double> *)&portz,&this->Vec,hit.Z);
    TVector3<double>::operator+
              ((TVector3<double> *)local_d8,&this->Start,(TVector3<double> *)&portz);
    pdVar1 = &(this->Vec).Z;
    if ((0.0 < *pdVar1 || *pdVar1 == 0.0) ||
       (bVar5 = sector_t::PortalBlocksMovement(this->CurSector,0), bVar5)) {
      if (((0.0 < (this->Vec).Z) &&
          ((bVar5 = sector_t::PortalBlocksMovement(this->CurSector,1), !bVar5 &&
           (local_100 = sector_t::GetPortalPlaneZ(this->CurSector,1), local_100 < hit.Y)))) &&
         (this->limitz < local_100)) {
        this->limitz = local_100;
        EnterSectorPortal(this,(FPathTraverse *)&in,1,
                          (local_100 - (this->Start).Z) / ((this->Vec).Z * this->MaxDist),
                          this->CurSector);
        goto LAB_006db021;
      }
    }
    else {
      portz_1 = sector_t::GetPortalPlaneZ(this->CurSector,0);
      if ((hit.Y < portz_1) && (portz_1 < this->limitz)) {
        this->limitz = portz_1;
        EnterSectorPortal(this,(FPathTraverse *)&in,0,
                          (portz_1 - (this->Start).Z) / ((this->Vec).Z * this->MaxDist),
                          this->CurSector);
        goto LAB_006db021;
      }
    }
    if ((in_00->isaline & 1U) == 0) {
      pAVar3 = (in_00->d).thing;
      TFlags<ActorFlag,_unsigned_int>::TFlags(&local_160,&this->ActorMask);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_15c,&pAVar3->flags);
      uVar8 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_15c);
      dVar13 = hit.Z;
      bVar5 = false;
      if (uVar8 != 0) {
        bVar5 = (in_00->d).thing != this->IgnoreThis;
      }
      if (!bVar5) goto LAB_006db021;
      TVector3<double>::TVector3(&local_178,(TVector3<double> *)local_d8);
      bVar5 = ThingCheck(this,in_00,dVar13,&local_178);
    }
    else {
      bVar6 = line_t::isLinePortal((in_00->d).line);
      bVar5 = false;
      if (bVar6) {
        TVector2<double>::TVector2((TVector2<double> *)&entersector,&this->Start);
        iVar7 = P_PointOnLineSidePrecise((DVector2 *)&entersector,(in_00->d).line);
        bVar5 = iVar7 == 0;
      }
      dVar13 = hit.Y;
      if (bVar5) {
        local_118 = ((in_00->d).line)->backsector;
        bVar5 = true;
        if (local_118 != (sector_t *)0x0) {
          psVar10 = &local_118->floorplane;
          TVector2<double>::TVector2(&local_128,(TVector3<double> *)local_d8);
          dVar12 = secplane_t::ZatPoint(psVar10,&local_128);
          dVar11 = hit.Y;
          bVar5 = false;
          if (dVar12 <= dVar13) {
            psVar10 = &local_118->ceilingplane;
            TVector2<double>::TVector2((TVector2<double> *)&port,(TVector3<double> *)local_d8);
            dVar13 = secplane_t::ZatPoint(psVar10,(DVector2 *)&port);
            bVar5 = dVar11 <= dVar13;
          }
        }
        if ((bVar5) &&
           ((local_140 = line_t::getPortal((in_00->d).line), local_140->mType == '\x03' ||
            ((this->TraceFlags & 8) == 0)))) {
          EnterLinePortal(this,(FPathTraverse *)&in,in_00);
          goto LAB_006db021;
        }
      }
      dVar13 = hit.Z;
      TVector3<double>::TVector3(&local_158,(TVector3<double> *)local_d8);
      bVar5 = LineCheck(this,in_00,dVar13,&local_158);
    }
    if (!bVar5) {
LAB_006db88a:
      if (this->Results->HitType == TRACE_HitNone) {
        bVar5 = sector_t::PortalBlocksMovement(this->CurSector,0);
        if ((bVar5) && (bVar5 = CheckSectorPlane(this,this->CurSector,true), bVar5)) {
          this->Results->HitType = TRACE_HitFloor;
          local_17c = (int)sector_t::GetTexture(this->CurSector,0);
          (this->Results->HitTexture).texnum = local_17c;
        }
        else {
          bVar5 = sector_t::PortalBlocksMovement(this->CurSector,1);
          if ((bVar5) && (bVar5 = CheckSectorPlane(this,this->CurSector,false), bVar5)) {
            this->Results->HitType = TRACE_HitCeiling;
            local_180 = (int)sector_t::GetTexture(this->CurSector,1);
            (this->Results->HitTexture).texnum = local_180;
          }
        }
      }
      this->Results->Sector = sectors + this->CurSector->sectornum;
      bVar5 = false;
      if ((this->Results->CrossedWater == (sector_t *)0x0) &&
         (bVar5 = false, this->CurSector->heightsec != (sector_t *)0x0)) {
        psVar4 = this->CurSector->heightsec;
        TVector2<double>::TVector2(&local_190,&this->Start);
        dVar13 = secplane_t::ZatPoint(&psVar4->floorplane,&local_190);
        bVar5 = false;
        if (dVar13 < (this->Start).Z) {
          psVar4 = this->CurSector->heightsec;
          TVector2<double>::TVector2((TVector2<double> *)&res,&this->Results->HitPos);
          dVar13 = secplane_t::ZatPoint(&psVar4->floorplane,(DVector2 *)&res);
          bVar5 = (this->Results->HitPos).Z <= dVar13;
        }
      }
      if (bVar5) {
        hsecResult.Crossed3DWaterPos.Z = (double)this->Results;
        FTraceResults::FTraceResults((FTraceResults *)local_278);
        this->Results = (FTraceResults *)local_278;
        bVar5 = CheckSectorPlane(this,this->CurSector->heightsec,true);
        if (bVar5) {
          this->Results->CrossedWater = sectors + this->CurSector->sectornum;
          TVector3<double>::operator=(&this->Results->CrossedWaterPos,&this->Results->HitPos);
          this->Results->Distance = 0.0;
        }
        this->Results = (FTraceResults *)hsecResult.Crossed3DWaterPos.Z;
      }
      if (((this->Results->HitType == TRACE_HitNone) &&
          (dVar13 = this->Results->Distance, dVar13 == 0.0)) && (!NAN(dVar13))) {
        ::operator*(&local_2a8,&this->Vec,this->MaxDist);
        TVector3<double>::operator+(&local_290,&this->Start,&local_2a8);
        TVector3<double>::operator=(&this->Results->HitPos,&local_290);
        SetSourcePosition(this);
        this->Results->Distance = this->MaxDist;
        this->Results->Fraction = 1.0;
      }
      EVar2 = this->Results->HitType;
      FPathTraverse::~FPathTraverse((FPathTraverse *)&in);
      return EVar2 != TRACE_HitNone;
    }
  } while( true );
}

Assistant:

bool FTraceInfo::TraceTraverse (int ptflags)
{
	// Do a 3D floor check in the starting sector
	Setup3DFloors();

	FPathTraverse it(Start.X, Start.Y, Vec.X * MaxDist, Vec.Y * MaxDist, ptflags | PT_DELTA, startfrac);
	intercept_t *in;
	int lastsplashsector = -1;

	while ((in = it.Next()))
	{
		// Deal with splashes in 3D floors (but only run once per sector, not each iteration - and stop if something was found.)
		if (Results->Crossed3DWater == NULL && lastsplashsector != CurSector->sectornum)
		{
			for (auto rover : CurSector->e->XFloor.ffloors)
			{
				if ((rover->flags & FF_EXISTS) && (rover->flags&FF_SWIMMABLE))
				{
					if (Check3DFloorPlane(rover, false))
					{
						// only consider if the plane is above the actual floor.
						if (rover->top.plane->ZatPoint(Results->HitPos) > CurSector->floorplane.ZatPoint(Results->HitPos))
						{
							Results->Crossed3DWater = rover;
							Results->Crossed3DWaterPos = Results->HitPos;
							Results->Distance = 0;
						}
					}
				}
			}
			lastsplashsector = CurSector->sectornum;
		}

		double dist = MaxDist * in->frac;
		DVector3 hit = Start + Vec * dist;

		// Crossed a floor portal? 
		if (Vec.Z < 0 && !CurSector->PortalBlocksMovement(sector_t::floor))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::floor);
			if (hit.Z < portz && limitz > portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::floor, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}
		// ... or a ceiling portal?
		else if (Vec.Z > 0 && !CurSector->PortalBlocksMovement(sector_t::ceiling))
		{
			// calculate position where the portal is crossed
			double portz = CurSector->GetPortalPlaneZ(sector_t::ceiling);
			if (hit.Z > portz && limitz < portz)
			{
				limitz = portz;
				EnterSectorPortal(it, sector_t::ceiling, (portz - Start.Z) / (Vec.Z * MaxDist), CurSector);
				continue;
			}
		}

		if (in->isaline)
		{
			if (in->d.line->isLinePortal() && P_PointOnLineSidePrecise(Start, in->d.line) == 0)
			{
				sector_t *entersector = in->d.line->backsector;
				if (entersector == NULL || (hit.Z >= entersector->floorplane.ZatPoint(hit) && hit.Z <= entersector->ceilingplane.ZatPoint(hit)))
				{
					FLinePortal *port = in->d.line->getPortal();
					// The caller cannot handle portals without global offset.
					if (port->mType == PORTT_LINKED || !(TraceFlags & TRACE_PortalRestrict))
					{
						EnterLinePortal(it, in);
						continue;
					}
				}
			}
			if (!LineCheck(in, dist, hit)) break;
		}
		else if ((in->d.thing->flags & ActorMask) && in->d.thing != IgnoreThis)
		{
			if (!ThingCheck(in, dist, hit)) break;
		}
	}

	if (Results->HitType == TRACE_HitNone)
	{
		if (CurSector->PortalBlocksMovement(sector_t::floor) && CheckSectorPlane(CurSector, true))
		{
			Results->HitType = TRACE_HitFloor;
			Results->HitTexture = CurSector->GetTexture(sector_t::floor);
		}
		else if (CurSector->PortalBlocksMovement(sector_t::ceiling) && CheckSectorPlane(CurSector, false))
		{
			Results->HitType = TRACE_HitCeiling;
			Results->HitTexture = CurSector->GetTexture(sector_t::ceiling);
		}
	}

	// check for intersection with floor/ceiling
	Results->Sector = &sectors[CurSector->sectornum];

	if (Results->CrossedWater == NULL &&
		CurSector->heightsec != NULL &&
		CurSector->heightsec->floorplane.ZatPoint(Start) < Start.Z &&
		CurSector->heightsec->floorplane.ZatPoint(Results->HitPos) >= Results->HitPos.Z)
	{
		// Save the result so that the water check doesn't destroy it.
		FTraceResults *res = Results;
		FTraceResults hsecResult;
		Results = &hsecResult;

		if (CheckSectorPlane(CurSector->heightsec, true))
		{
			Results->CrossedWater = &sectors[CurSector->sectornum];
			Results->CrossedWaterPos = Results->HitPos;
			Results->Distance = 0;
		}
		Results = res;
	}
	if (Results->HitType == TRACE_HitNone && Results->Distance == 0)
	{
		Results->HitPos = Start + Vec * MaxDist;
		SetSourcePosition();
		Results->Distance = MaxDist;
		Results->Fraction = 1.;
	}
	return Results->HitType != TRACE_HitNone;
}